

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.h
# Opt level: O3

Reader __thiscall capnp::_::OrphanBuilder::asDataReader(OrphanBuilder *this)

{
  word *pwVar1;
  Arena *pAVar2;
  ReadLimiter *pRVar3;
  ulong uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SegmentBuilder **ppSVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  OrphanBuilder *pOVar13;
  Reader RVar14;
  SegmentBuilder *pSVar6;
  
  uVar9 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && uVar9 == 0) {
    uVar10 = 0;
    ppSVar7 = (SegmentBuilder **)0x0;
    goto LAB_001845e9;
  }
  pSVar6 = this->segment;
  ppSVar7 = (SegmentBuilder **)this->location;
  if (pSVar6 == (SegmentBuilder *)0x0) {
    pSVar6 = (SegmentBuilder *)0x0;
LAB_00184558:
    pOVar13 = this;
    if (ppSVar7 != (SegmentBuilder **)0x0) {
LAB_00184560:
      uVar9 = (uint)(pOVar13->tag).content;
LAB_00184563:
      if ((uVar9 & 3) == 1) {
        uVar9 = *(uint *)((long)&(pOVar13->tag).content + 4);
        if ((uVar9 & 7) == 2) {
          uVar9 = uVar9 >> 3;
          if (pSVar6 == (SegmentBuilder *)0x0) {
LAB_001845ad:
            uVar10 = (ulong)uVar9;
            goto LAB_001845e9;
          }
          uVar10 = (ulong)(uVar9 + 7 >> 3);
          if (((long)ppSVar7 - (long)(pSVar6->super_SegmentReader).ptr.ptr >> 3) + uVar10 <=
              (pSVar6->super_SegmentReader).ptr.size_) {
            pRVar3 = (pSVar6->super_SegmentReader).readLimiter;
            uVar8 = pRVar3->limit;
            if (uVar10 <= uVar8) {
              pRVar3->limit = uVar8 - uVar10;
              goto LAB_001845ad;
            }
            (*((pSVar6->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          asDataReader();
        }
        else {
          asDataReader();
        }
      }
      else {
        asDataReader();
      }
    }
  }
  else {
    if ((uVar9 & 3) != 2) goto LAB_00184558;
    iVar5 = (*((pSVar6->super_SegmentReader).arena)->_vptr_Arena[2])();
    pSVar6 = (SegmentBuilder *)CONCAT44(extraout_var,iVar5);
    if (pSVar6 != (SegmentBuilder *)0x0) {
      uVar10 = (pSVar6->super_SegmentReader).ptr.size_;
      uVar9 = (uint)(this->tag).content;
      uVar8 = (ulong)(uVar9 >> 3);
      if ((long)uVar10 < (long)(ulong)(uVar9 >> 3)) {
        uVar8 = uVar10;
      }
      uVar12 = 2 - (ulong)((uVar9 & 4) == 0);
      if (uVar10 < uVar8 + uVar12) {
LAB_001845d9:
        asDataReader();
        goto LAB_001845de;
      }
      pwVar1 = (pSVar6->super_SegmentReader).ptr.ptr;
      pAVar2 = (pSVar6->super_SegmentReader).arena;
      pRVar3 = (pSVar6->super_SegmentReader).readLimiter;
      uVar4 = pRVar3->limit;
      if (uVar4 < uVar12) {
        (*pAVar2->_vptr_Arena[3])();
        goto LAB_001845d9;
      }
      pOVar13 = (OrphanBuilder *)(pwVar1 + uVar8);
      this = (OrphanBuilder *)&pOVar13->segment;
      pRVar3->limit = uVar4 - uVar12;
      if ((uVar9 & 4) != 0) {
        iVar5 = (*pAVar2->_vptr_Arena[2])
                          (pAVar2,(ulong)*(uint *)((long)&(pOVar13->tag).content + 4));
        pSVar6 = (SegmentBuilder *)CONCAT44(extraout_var_00,iVar5);
        if (pSVar6 == (SegmentBuilder *)0x0) {
          asDataReader();
        }
        else {
          uVar9 = (uint)(pOVar13->tag).content;
          if ((uVar9 & 3) == 2) {
            uVar8 = (ulong)(uVar9 >> 3);
            uVar10 = (pSVar6->super_SegmentReader).ptr.size_;
            if ((long)uVar10 < (long)uVar8) {
              uVar8 = uVar10;
            }
            ppSVar7 = (SegmentBuilder **)((pSVar6->super_SegmentReader).ptr.ptr + uVar8);
            goto LAB_00184558;
          }
          asDataReader();
        }
        goto LAB_001845de;
      }
      uVar9 = (uint)(pOVar13->tag).content;
      lVar11 = (long)((int)uVar9 >> 2);
      ppSVar7 = (SegmentBuilder **)(pwVar1 + uVar10);
      if ((lVar11 < (long)pwVar1 - (long)this >> 3) || ((long)ppSVar7 - (long)this >> 3 < lVar11))
      goto LAB_00184560;
      ppSVar7 = (SegmentBuilder **)((long)this + lVar11 * 8);
      goto LAB_00184563;
    }
    asDataReader();
  }
LAB_001845de:
  uVar10 = 0;
  ppSVar7 = (SegmentBuilder **)0x0;
LAB_001845e9:
  RVar14.super_ArrayPtr<const_unsigned_char>.size_ = uVar10;
  RVar14.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)ppSVar7;
  return (Reader)RVar14.super_ArrayPtr<const_unsigned_char>;
}

Assistant:

KJ_ALWAYS_INLINE(T get() const) { return value; }